

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Question_&> __thiscall
capnp::_::anon_unknown_18::
ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::find
          (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this,
          uint id)

{
  long lVar1;
  ulong uVar2;
  Question *pQVar3;
  uint in_EDX;
  undefined4 in_register_00000034;
  long *plVar4;
  ulong uVar5;
  long local_18;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,id);
  if ((int)in_EDX < 0) {
    kj::
    Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>>
    ::find<0ul,unsigned_int&>
              ((Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>>
                *)&local_18,(uint *)(plVar4 + 8));
    pQVar3 = (Question *)(local_18 + 8);
    if (local_18 == 0) {
      pQVar3 = (Question *)0x0;
    }
    (this->slots).builder.ptr = pQVar3;
  }
  else {
    uVar2 = (ulong)in_EDX;
    lVar1 = *plVar4;
    uVar5 = (plVar4[1] - lVar1 >> 3) * -0x3333333333333333;
    if ((uVar5 < uVar2 || uVar5 - uVar2 == 0) ||
       ((*(char *)(lVar1 + 0x20 + uVar2 * 0x28) == '\0' &&
        (*(long *)(lVar1 + 0x18 + uVar2 * 0x28) == 0)))) {
      (this->slots).builder.ptr = (Question *)0x0;
    }
    else {
      (this->slots).builder.ptr = (Question *)(lVar1 + uVar2 * 0x28);
    }
  }
  return (Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Question_&>)(Question *)this;
}

Assistant:

kj::Maybe<T&> find(Id id) {
    if (isHigh(id)) {
      return highSlots.find(id);
    } else if (id < slots.size() && slots[id] != nullptr) {
      return slots[id];
    } else {
      return kj::none;
    }
  }